

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

int __thiscall tcu::Texture1DArrayView::selectLayer(Texture1DArrayView *this,float r)

{
  deInt32 x;
  int iVar1;
  float r_local;
  Texture1DArrayView *this_local;
  
  x = deFloorFloatToInt32(r + 0.5);
  iVar1 = ConstPixelBufferAccess::getHeight(this->m_levels);
  iVar1 = de::clamp<int>(x,0,iVar1 + -1);
  return iVar1;
}

Assistant:

inline int Texture1DArrayView::selectLayer (float r) const
{
	DE_ASSERT(m_numLevels > 0 && m_levels);
	return de::clamp(deFloorFloatToInt32(r + 0.5f), 0, m_levels[0].getHeight()-1);
}